

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  ulong uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  int iVar27;
  undefined4 uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  ulong uVar33;
  long lVar34;
  undefined1 (*pauVar35) [16];
  ulong uVar36;
  undefined1 (*pauVar37) [16];
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  long lVar40;
  ulong unaff_R13;
  size_t mask;
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  float fVar68;
  undefined1 auVar69 [32];
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar70 [64];
  uint uVar74;
  uint uVar76;
  uint uVar77;
  undefined1 auVar75 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  RTCFilterFunctionNArguments local_28d0;
  undefined1 local_28a0 [32];
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  RTCHitN local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar56 [32];
  undefined1 auVar60 [32];
  
  pauVar37 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar92 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2520._4_4_ = fVar2;
  local_2520._0_4_ = fVar2;
  local_2520._8_4_ = fVar2;
  local_2520._12_4_ = fVar2;
  local_2520._16_4_ = fVar2;
  local_2520._20_4_ = fVar2;
  local_2520._24_4_ = fVar2;
  local_2520._28_4_ = fVar2;
  auVar64 = ZEXT3264(local_2520);
  fVar68 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_2540._4_4_ = fVar68;
  local_2540._0_4_ = fVar68;
  local_2540._8_4_ = fVar68;
  local_2540._12_4_ = fVar68;
  local_2540._16_4_ = fVar68;
  local_2540._20_4_ = fVar68;
  local_2540._24_4_ = fVar68;
  local_2540._28_4_ = fVar68;
  auVar67 = ZEXT3264(local_2540);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar68 = fVar68 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar27 = (tray->tfar).field_0.i[k];
  auVar46 = ZEXT3264(CONCAT428(iVar27,CONCAT424(iVar27,CONCAT420(iVar27,CONCAT416(iVar27,CONCAT412(
                                                  iVar27,CONCAT48(iVar27,CONCAT44(iVar27,iVar27)))))
                                               )));
  local_2500._8_4_ = 0x80000000;
  local_2500._0_8_ = 0x8000000080000000;
  local_2500._12_4_ = 0x80000000;
  local_2500._16_4_ = 0x80000000;
  local_2500._20_4_ = 0x80000000;
  local_2500._24_4_ = 0x80000000;
  local_2500._28_4_ = 0x80000000;
  local_2560._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_2560._8_4_ = -fVar1;
  local_2560._12_4_ = -fVar1;
  local_2560._16_4_ = -fVar1;
  local_2560._20_4_ = -fVar1;
  local_2560._24_4_ = -fVar1;
  local_2560._28_4_ = -fVar1;
  auVar70 = ZEXT3264(local_2560);
  local_2580._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_2580._8_4_ = -fVar2;
  local_2580._12_4_ = -fVar2;
  local_2580._16_4_ = -fVar2;
  local_2580._20_4_ = -fVar2;
  local_2580._24_4_ = -fVar2;
  local_2580._28_4_ = -fVar2;
  auVar75 = ZEXT3264(local_2580);
  local_25a0._0_8_ = CONCAT44(fVar68,fVar68) ^ 0x8000000080000000;
  local_25a0._8_4_ = -fVar68;
  local_25a0._12_4_ = -fVar68;
  local_25a0._16_4_ = -fVar68;
  local_25a0._20_4_ = -fVar68;
  local_25a0._24_4_ = -fVar68;
  local_25a0._28_4_ = -fVar68;
  auVar81 = ZEXT3264(local_25a0);
  iVar27 = (tray->tnear).field_0.i[k];
  local_25c0._4_4_ = iVar27;
  local_25c0._0_4_ = iVar27;
  local_25c0._8_4_ = iVar27;
  local_25c0._12_4_ = iVar27;
  local_25c0._16_4_ = iVar27;
  local_25c0._20_4_ = iVar27;
  local_25c0._24_4_ = iVar27;
  local_25c0._28_4_ = iVar27;
  auVar84 = ZEXT3264(local_25c0);
  local_25e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_25e0._0_16_ = mm_lookupmask_ps._0_16_;
  iVar27 = 1 << ((uint)k & 0x1f);
  auVar66._4_4_ = iVar27;
  auVar66._0_4_ = iVar27;
  auVar66._8_4_ = iVar27;
  auVar66._12_4_ = iVar27;
  auVar66._16_4_ = iVar27;
  auVar66._20_4_ = iVar27;
  auVar66._24_4_ = iVar27;
  auVar66._28_4_ = iVar27;
  auVar49 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar66 = vpand_avx2(auVar66,auVar49);
  local_2620 = vpcmpeqd_avx2(auVar66,auVar49);
  auVar54._8_4_ = 0x3f800000;
  auVar54._0_8_ = &DAT_3f8000003f800000;
  auVar54._12_4_ = 0x3f800000;
  auVar54._16_4_ = 0x3f800000;
  auVar54._20_4_ = 0x3f800000;
  auVar54._24_4_ = 0x3f800000;
  auVar54._28_4_ = 0x3f800000;
  auVar49._8_4_ = 0xbf800000;
  auVar49._0_8_ = 0xbf800000bf800000;
  auVar49._12_4_ = 0xbf800000;
  auVar49._16_4_ = 0xbf800000;
  auVar49._20_4_ = 0xbf800000;
  auVar49._24_4_ = 0xbf800000;
  auVar49._28_4_ = 0xbf800000;
  local_2600 = vblendvps_avx(auVar54,auVar49,local_25e0);
  do {
    do {
      do {
        if (pauVar37 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar38 = pauVar37 + -1;
        pauVar37 = pauVar37 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar38 + 8));
      uVar42 = *(ulong *)*pauVar37;
      do {
        auVar78 = auVar81._0_32_;
        auVar43 = auVar75._0_32_;
        auVar54 = auVar70._0_32_;
        auVar49 = auVar67._0_32_;
        auVar66 = auVar64._0_32_;
        if ((uVar42 & 8) == 0) {
          auVar47 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar42 + 0x40 + uVar39),auVar54,
                                    auVar92._0_32_);
          auVar52 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar42 + 0x40 + uVar31),auVar43,auVar66);
          auVar13 = vpmaxsd_avx2(ZEXT1632(auVar47),ZEXT1632(auVar52));
          auVar47 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar42 + 0x40 + uVar36),auVar78,auVar49);
          auVar14 = vpmaxsd_avx2(ZEXT1632(auVar47),auVar84._0_32_);
          local_2840 = vpmaxsd_avx2(auVar13,auVar14);
          auVar47 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar42 + 0x40 + (uVar39 ^ 0x20)),auVar54,
                                    auVar92._0_32_);
          auVar52 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar42 + 0x40 + (uVar31 ^ 0x20)),auVar43,
                                    auVar66);
          auVar13 = vpminsd_avx2(ZEXT1632(auVar47),ZEXT1632(auVar52));
          auVar47 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar42 + 0x40 + (uVar36 ^ 0x20)),auVar78,
                                    auVar49);
          auVar14 = vpminsd_avx2(ZEXT1632(auVar47),auVar46._0_32_);
          auVar13 = vpminsd_avx2(auVar13,auVar14);
          auVar13 = vpcmpgtd_avx2(local_2840,auVar13);
          uVar28 = vmovmskps_avx(auVar13);
          unaff_R13 = (ulong)(byte)~(byte)uVar28;
        }
        if ((uVar42 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar27 = 4;
          }
          else {
            uVar41 = uVar42 & 0xfffffffffffffff0;
            lVar40 = 0;
            for (uVar42 = unaff_R13; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
              lVar40 = lVar40 + 1;
            }
            iVar27 = 0;
            uVar33 = unaff_R13 - 1 & unaff_R13;
            uVar42 = *(ulong *)(uVar41 + lVar40 * 8);
            if (uVar33 != 0) {
              uVar74 = *(uint *)(local_2840 + lVar40 * 4);
              lVar40 = 0;
              for (uVar15 = uVar33; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                lVar40 = lVar40 + 1;
              }
              uVar33 = uVar33 - 1 & uVar33;
              uVar15 = *(ulong *)(uVar41 + lVar40 * 8);
              uVar29 = *(uint *)(local_2840 + lVar40 * 4);
              if (uVar33 == 0) {
                if (uVar74 < uVar29) {
                  *(ulong *)*pauVar37 = uVar15;
                  *(uint *)(*pauVar37 + 8) = uVar29;
                  pauVar37 = pauVar37 + 1;
                }
                else {
                  *(ulong *)*pauVar37 = uVar42;
                  *(uint *)(*pauVar37 + 8) = uVar74;
                  pauVar37 = pauVar37 + 1;
                  uVar42 = uVar15;
                }
              }
              else {
                auVar47._8_8_ = 0;
                auVar47._0_8_ = uVar42;
                auVar47 = vpunpcklqdq_avx(auVar47,ZEXT416(uVar74));
                auVar52._8_8_ = 0;
                auVar52._0_8_ = uVar15;
                auVar52 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar29));
                lVar40 = 0;
                for (uVar42 = uVar33; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000)
                {
                  lVar40 = lVar40 + 1;
                }
                uVar33 = uVar33 - 1 & uVar33;
                auVar57._8_8_ = 0;
                auVar57._0_8_ = *(ulong *)(uVar41 + lVar40 * 8);
                auVar48 = vpunpcklqdq_avx(auVar57,ZEXT416(*(uint *)(local_2840 + lVar40 * 4)));
                auVar57 = vpcmpgtd_avx(auVar52,auVar47);
                if (uVar33 == 0) {
                  auVar62 = vpshufd_avx(auVar57,0xaa);
                  auVar57 = vblendvps_avx(auVar52,auVar47,auVar62);
                  auVar47 = vblendvps_avx(auVar47,auVar52,auVar62);
                  auVar52 = vpcmpgtd_avx(auVar48,auVar57);
                  auVar62 = vpshufd_avx(auVar52,0xaa);
                  auVar52 = vblendvps_avx(auVar48,auVar57,auVar62);
                  auVar57 = vblendvps_avx(auVar57,auVar48,auVar62);
                  auVar48 = vpcmpgtd_avx(auVar57,auVar47);
                  auVar62 = vpshufd_avx(auVar48,0xaa);
                  auVar48 = vblendvps_avx(auVar57,auVar47,auVar62);
                  auVar47 = vblendvps_avx(auVar47,auVar57,auVar62);
                  *pauVar37 = auVar47;
                  pauVar37[1] = auVar48;
                  uVar42 = auVar52._0_8_;
                  pauVar37 = pauVar37 + 2;
                }
                else {
                  lVar40 = 0;
                  for (uVar42 = uVar33; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000
                      ) {
                    lVar40 = lVar40 + 1;
                  }
                  uVar33 = uVar33 - 1 & uVar33;
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = *(ulong *)(uVar41 + lVar40 * 8);
                  auVar62 = vpunpcklqdq_avx(auVar62,ZEXT416(*(uint *)(local_2840 + lVar40 * 4)));
                  if (uVar33 == 0) {
                    auVar53 = vpshufd_avx(auVar57,0xaa);
                    auVar57 = vblendvps_avx(auVar52,auVar47,auVar53);
                    auVar47 = vblendvps_avx(auVar47,auVar52,auVar53);
                    auVar52 = vpcmpgtd_avx(auVar62,auVar48);
                    auVar53 = vpshufd_avx(auVar52,0xaa);
                    auVar52 = vblendvps_avx(auVar62,auVar48,auVar53);
                    auVar48 = vblendvps_avx(auVar48,auVar62,auVar53);
                    auVar62 = vpcmpgtd_avx(auVar48,auVar47);
                    auVar53 = vpshufd_avx(auVar62,0xaa);
                    auVar62 = vblendvps_avx(auVar48,auVar47,auVar53);
                    auVar47 = vblendvps_avx(auVar47,auVar48,auVar53);
                    auVar48 = vpcmpgtd_avx(auVar52,auVar57);
                    auVar53 = vpshufd_avx(auVar48,0xaa);
                    auVar48 = vblendvps_avx(auVar52,auVar57,auVar53);
                    auVar52 = vblendvps_avx(auVar57,auVar52,auVar53);
                    auVar57 = vpcmpgtd_avx(auVar62,auVar52);
                    auVar53 = vpshufd_avx(auVar57,0xaa);
                    auVar57 = vblendvps_avx(auVar62,auVar52,auVar53);
                    auVar52 = vblendvps_avx(auVar52,auVar62,auVar53);
                    *pauVar37 = auVar47;
                    pauVar37[1] = auVar52;
                    pauVar37[2] = auVar57;
                    uVar42 = auVar48._0_8_;
                    pauVar38 = pauVar37 + 3;
                  }
                  else {
                    *pauVar37 = auVar47;
                    pauVar37[1] = auVar52;
                    pauVar37[2] = auVar48;
                    pauVar37[3] = auVar62;
                    lVar40 = 0x30;
                    do {
                      lVar34 = lVar40;
                      lVar40 = 0;
                      for (uVar42 = uVar33; (uVar42 & 1) == 0;
                          uVar42 = uVar42 >> 1 | 0x8000000000000000) {
                        lVar40 = lVar40 + 1;
                      }
                      auVar48._8_8_ = 0;
                      auVar48._0_8_ = *(ulong *)(uVar41 + lVar40 * 8);
                      auVar47 = vpunpcklqdq_avx(auVar48,ZEXT416(*(uint *)(local_2840 + lVar40 * 4)))
                      ;
                      *(undefined1 (*) [16])(pauVar37[1] + lVar34) = auVar47;
                      uVar33 = uVar33 - 1 & uVar33;
                      lVar40 = lVar34 + 0x10;
                    } while (uVar33 != 0);
                    pauVar38 = (undefined1 (*) [16])(pauVar37[1] + lVar34);
                    if (lVar34 + 0x10 != 0) {
                      lVar40 = 0x10;
                      pauVar32 = pauVar37;
                      do {
                        auVar47 = pauVar32[1];
                        uVar74 = *(uint *)(pauVar32[1] + 8);
                        pauVar32 = pauVar32 + 1;
                        lVar34 = lVar40;
                        do {
                          if (uVar74 <= *(uint *)(pauVar37[-1] + lVar34 + 8)) {
                            pauVar35 = (undefined1 (*) [16])(*pauVar37 + lVar34);
                            break;
                          }
                          *(undefined1 (*) [16])(*pauVar37 + lVar34) =
                               *(undefined1 (*) [16])(pauVar37[-1] + lVar34);
                          lVar34 = lVar34 + -0x10;
                          pauVar35 = pauVar37;
                        } while (lVar34 != 0);
                        *pauVar35 = auVar47;
                        lVar40 = lVar40 + 0x10;
                      } while (pauVar38 != pauVar32);
                    }
                    uVar42 = *(ulong *)*pauVar38;
                  }
                  auVar64 = ZEXT3264(auVar66);
                  auVar67 = ZEXT3264(auVar49);
                  auVar70 = ZEXT3264(auVar54);
                  auVar75 = ZEXT3264(auVar43);
                  auVar81 = ZEXT3264(auVar78);
                  auVar84 = ZEXT3264(auVar84._0_32_);
                  pauVar37 = pauVar38;
                  iVar27 = 0;
                }
              }
            }
          }
        }
        else {
          iVar27 = 6;
        }
      } while (iVar27 == 0);
    } while (iVar27 != 6);
    uVar41 = (ulong)((uint)uVar42 & 0xf);
    if (uVar41 != 8) {
      uVar42 = uVar42 & 0xfffffffffffffff0;
      lVar40 = 0;
      do {
        lVar30 = lVar40 * 0xe0;
        lVar34 = uVar42 + 0xd0 + lVar30;
        local_2860 = *(undefined8 *)(lVar34 + 0x10);
        uStack_2858 = *(undefined8 *)(lVar34 + 0x18);
        lVar34 = uVar42 + 0xc0 + lVar30;
        local_24e0 = *(undefined8 *)(lVar34 + 0x10);
        uStack_24d8 = *(undefined8 *)(lVar34 + 0x18);
        uStack_24d0 = local_24e0;
        uStack_24c8 = uStack_24d8;
        uStack_2850 = local_2860;
        uStack_2848 = uStack_2858;
        auVar59._16_16_ = *(undefined1 (*) [16])(uVar42 + 0x60 + lVar30);
        auVar59._0_16_ = *(undefined1 (*) [16])(uVar42 + lVar30);
        auVar63._16_16_ = *(undefined1 (*) [16])(uVar42 + 0x70 + lVar30);
        auVar63._0_16_ = *(undefined1 (*) [16])(uVar42 + 0x10 + lVar30);
        auVar65._16_16_ = *(undefined1 (*) [16])(uVar42 + 0x80 + lVar30);
        auVar65._0_16_ = *(undefined1 (*) [16])(uVar42 + 0x20 + lVar30);
        auVar47 = *(undefined1 (*) [16])(uVar42 + 0x30 + lVar30);
        auVar43._16_16_ = auVar47;
        auVar43._0_16_ = auVar47;
        auVar52 = *(undefined1 (*) [16])(uVar42 + 0x40 + lVar30);
        auVar50._16_16_ = auVar52;
        auVar50._0_16_ = auVar52;
        auVar57 = *(undefined1 (*) [16])(uVar42 + 0x50 + lVar30);
        auVar55._16_16_ = auVar57;
        auVar55._0_16_ = auVar57;
        auVar57 = *(undefined1 (*) [16])(uVar42 + 0x90 + lVar30);
        auVar61._16_16_ = auVar57;
        auVar61._0_16_ = auVar57;
        auVar57 = *(undefined1 (*) [16])(uVar42 + 0xa0 + lVar30);
        auVar79._16_16_ = auVar57;
        auVar79._0_16_ = auVar57;
        auVar57 = *(undefined1 (*) [16])(uVar42 + 0xb0 + lVar30);
        auVar82._16_16_ = auVar57;
        auVar82._0_16_ = auVar57;
        auVar49 = vsubps_avx(auVar59,auVar43);
        auVar66 = vsubps_avx(auVar63,auVar50);
        auVar54 = vsubps_avx(auVar65,auVar55);
        auVar43 = vsubps_avx(auVar61,auVar59);
        auVar78 = vsubps_avx(auVar79,auVar63);
        auVar13 = vsubps_avx(auVar82,auVar65);
        auVar14._4_4_ = auVar66._4_4_ * auVar13._4_4_;
        auVar14._0_4_ = auVar66._0_4_ * auVar13._0_4_;
        auVar14._8_4_ = auVar66._8_4_ * auVar13._8_4_;
        auVar14._12_4_ = auVar66._12_4_ * auVar13._12_4_;
        auVar14._16_4_ = auVar66._16_4_ * auVar13._16_4_;
        auVar14._20_4_ = auVar66._20_4_ * auVar13._20_4_;
        auVar14._24_4_ = auVar66._24_4_ * auVar13._24_4_;
        auVar14._28_4_ = auVar47._12_4_;
        auVar48 = vfmsub231ps_fma(auVar14,auVar78,auVar54);
        uVar28 = *(undefined4 *)(ray + k * 4);
        auVar85._4_4_ = uVar28;
        auVar85._0_4_ = uVar28;
        auVar85._8_4_ = uVar28;
        auVar85._12_4_ = uVar28;
        auVar85._16_4_ = uVar28;
        auVar85._20_4_ = uVar28;
        auVar85._24_4_ = uVar28;
        auVar85._28_4_ = uVar28;
        uVar28 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar88._4_4_ = uVar28;
        auVar88._0_4_ = uVar28;
        auVar88._8_4_ = uVar28;
        auVar88._12_4_ = uVar28;
        auVar88._16_4_ = uVar28;
        auVar88._20_4_ = uVar28;
        auVar88._24_4_ = uVar28;
        auVar88._28_4_ = uVar28;
        uVar28 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar90._4_4_ = uVar28;
        auVar90._0_4_ = uVar28;
        auVar90._8_4_ = uVar28;
        auVar90._12_4_ = uVar28;
        auVar90._16_4_ = uVar28;
        auVar90._20_4_ = uVar28;
        auVar90._24_4_ = uVar28;
        auVar90._28_4_ = uVar28;
        fVar1 = *(float *)(ray + k * 4 + 0x80);
        auVar80._4_4_ = fVar1;
        auVar80._0_4_ = fVar1;
        auVar80._8_4_ = fVar1;
        auVar80._12_4_ = fVar1;
        auVar80._16_4_ = fVar1;
        auVar80._20_4_ = fVar1;
        auVar80._24_4_ = fVar1;
        auVar80._28_4_ = fVar1;
        auVar12._4_4_ = auVar54._4_4_ * auVar43._4_4_;
        auVar12._0_4_ = auVar54._0_4_ * auVar43._0_4_;
        auVar12._8_4_ = auVar54._8_4_ * auVar43._8_4_;
        auVar12._12_4_ = auVar54._12_4_ * auVar43._12_4_;
        auVar12._16_4_ = auVar54._16_4_ * auVar43._16_4_;
        auVar12._20_4_ = auVar54._20_4_ * auVar43._20_4_;
        auVar12._24_4_ = auVar54._24_4_ * auVar43._24_4_;
        auVar12._28_4_ = auVar52._12_4_;
        auVar14 = vsubps_avx(auVar59,auVar85);
        fVar2 = *(float *)(ray + k * 4 + 0xa0);
        auVar86._4_4_ = fVar2;
        auVar86._0_4_ = fVar2;
        auVar86._8_4_ = fVar2;
        auVar86._12_4_ = fVar2;
        auVar86._16_4_ = fVar2;
        auVar86._20_4_ = fVar2;
        auVar86._24_4_ = fVar2;
        auVar86._28_4_ = fVar2;
        auVar62 = vfmsub231ps_fma(auVar12,auVar13,auVar49);
        auVar12 = vsubps_avx(auVar63,auVar88);
        fVar68 = *(float *)(ray + k * 4 + 0xc0);
        auVar89._4_4_ = fVar68;
        auVar89._0_4_ = fVar68;
        auVar89._8_4_ = fVar68;
        auVar89._12_4_ = fVar68;
        auVar89._16_4_ = fVar68;
        auVar89._20_4_ = fVar68;
        auVar89._24_4_ = fVar68;
        auVar89._28_4_ = fVar68;
        auVar50 = vsubps_avx(auVar65,auVar90);
        auVar16._4_4_ = fVar1 * auVar12._4_4_;
        auVar16._0_4_ = fVar1 * auVar12._0_4_;
        auVar16._8_4_ = fVar1 * auVar12._8_4_;
        auVar16._12_4_ = fVar1 * auVar12._12_4_;
        auVar16._16_4_ = fVar1 * auVar12._16_4_;
        auVar16._20_4_ = fVar1 * auVar12._20_4_;
        auVar16._24_4_ = fVar1 * auVar12._24_4_;
        auVar16._28_4_ = uVar28;
        auVar47 = vfmsub231ps_fma(auVar16,auVar14,auVar86);
        auVar17._4_4_ = auVar13._4_4_ * auVar47._4_4_;
        auVar17._0_4_ = auVar13._0_4_ * auVar47._0_4_;
        auVar17._8_4_ = auVar13._8_4_ * auVar47._8_4_;
        auVar17._12_4_ = auVar13._12_4_ * auVar47._12_4_;
        auVar17._16_4_ = auVar13._16_4_ * 0.0;
        auVar17._20_4_ = auVar13._20_4_ * 0.0;
        auVar17._24_4_ = auVar13._24_4_ * 0.0;
        auVar17._28_4_ = auVar13._28_4_;
        auVar91._0_4_ = auVar54._0_4_ * auVar47._0_4_;
        auVar91._4_4_ = auVar54._4_4_ * auVar47._4_4_;
        auVar91._8_4_ = auVar54._8_4_ * auVar47._8_4_;
        auVar91._12_4_ = auVar54._12_4_ * auVar47._12_4_;
        auVar91._16_4_ = auVar54._16_4_ * 0.0;
        auVar91._20_4_ = auVar54._20_4_ * 0.0;
        auVar91._24_4_ = auVar54._24_4_ * 0.0;
        auVar91._28_4_ = 0;
        auVar13._4_4_ = fVar68 * auVar14._4_4_;
        auVar13._0_4_ = fVar68 * auVar14._0_4_;
        auVar13._8_4_ = fVar68 * auVar14._8_4_;
        auVar13._12_4_ = fVar68 * auVar14._12_4_;
        auVar13._16_4_ = fVar68 * auVar14._16_4_;
        auVar13._20_4_ = fVar68 * auVar14._20_4_;
        auVar13._24_4_ = fVar68 * auVar14._24_4_;
        auVar13._28_4_ = auVar54._28_4_;
        auVar52 = vfmsub231ps_fma(auVar13,auVar50,auVar80);
        auVar47 = vfmadd231ps_fma(auVar17,ZEXT1632(auVar52),auVar78);
        auVar52 = vfmadd231ps_fma(auVar91,auVar66,ZEXT1632(auVar52));
        auVar18._4_4_ = auVar49._4_4_ * auVar78._4_4_;
        auVar18._0_4_ = auVar49._0_4_ * auVar78._0_4_;
        auVar18._8_4_ = auVar49._8_4_ * auVar78._8_4_;
        auVar18._12_4_ = auVar49._12_4_ * auVar78._12_4_;
        auVar18._16_4_ = auVar49._16_4_ * auVar78._16_4_;
        auVar18._20_4_ = auVar49._20_4_ * auVar78._20_4_;
        auVar18._24_4_ = auVar49._24_4_ * auVar78._24_4_;
        auVar18._28_4_ = auVar78._28_4_;
        auVar53 = vfmsub231ps_fma(auVar18,auVar43,auVar66);
        auVar78._4_4_ = fVar2 * auVar50._4_4_;
        auVar78._0_4_ = fVar2 * auVar50._0_4_;
        auVar78._8_4_ = fVar2 * auVar50._8_4_;
        auVar78._12_4_ = fVar2 * auVar50._12_4_;
        auVar78._16_4_ = fVar2 * auVar50._16_4_;
        auVar78._20_4_ = fVar2 * auVar50._20_4_;
        auVar78._24_4_ = fVar2 * auVar50._24_4_;
        auVar78._28_4_ = auVar66._28_4_;
        auVar58 = vfmsub231ps_fma(auVar78,auVar12,auVar89);
        fVar1 = auVar53._0_4_;
        fVar2 = auVar53._4_4_;
        auVar19._4_4_ = fVar68 * fVar2;
        auVar19._0_4_ = fVar68 * fVar1;
        fVar7 = auVar53._8_4_;
        auVar19._8_4_ = fVar68 * fVar7;
        fVar8 = auVar53._12_4_;
        auVar19._12_4_ = fVar68 * fVar8;
        auVar19._16_4_ = fVar68 * 0.0;
        auVar19._20_4_ = fVar68 * 0.0;
        auVar19._24_4_ = fVar68 * 0.0;
        auVar19._28_4_ = fVar68;
        auVar57 = vfmadd231ps_fma(auVar19,ZEXT1632(auVar62),auVar86);
        auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),ZEXT1632(auVar48),auVar80);
        auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),ZEXT1632(auVar58),auVar43);
        auVar66 = vandps_avx(ZEXT1632(auVar57),local_2500);
        uVar74 = auVar66._0_4_;
        local_2840._0_4_ = (float)(uVar74 ^ auVar47._0_4_);
        uVar29 = auVar66._4_4_;
        local_2840._4_4_ = (float)(uVar29 ^ auVar47._4_4_);
        uVar76 = auVar66._8_4_;
        local_2840._8_4_ = (float)(uVar76 ^ auVar47._8_4_);
        uVar77 = auVar66._12_4_;
        local_2840._12_4_ = (float)(uVar77 ^ auVar47._12_4_);
        local_2800._16_4_ = auVar66._16_4_;
        local_2840._16_4_ = local_2800._16_4_;
        local_2800._20_4_ = auVar66._20_4_;
        local_2840._20_4_ = local_2800._20_4_;
        local_2800._24_4_ = auVar66._24_4_;
        local_2840._24_4_ = local_2800._24_4_;
        local_2800._28_4_ = auVar66._28_4_;
        local_2840._28_4_ = local_2800._28_4_;
        auVar47 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar49,ZEXT1632(auVar58));
        local_2820._0_4_ = (float)(uVar74 ^ auVar47._0_4_);
        local_2820._4_4_ = (float)(uVar29 ^ auVar47._4_4_);
        local_2820._8_4_ = (float)(uVar76 ^ auVar47._8_4_);
        local_2820._12_4_ = (float)(uVar77 ^ auVar47._12_4_);
        local_2820._16_4_ = local_2800._16_4_;
        local_2820._20_4_ = local_2800._20_4_;
        local_2820._24_4_ = local_2800._24_4_;
        local_2820._28_4_ = local_2800._28_4_;
        auVar66 = vcmpps_avx(local_2840,ZEXT832(0) << 0x20,5);
        auVar49 = vcmpps_avx(local_2820,ZEXT832(0) << 0x20,5);
        auVar66 = vandps_avx(auVar66,auVar49);
        auVar69._8_4_ = 0x7fffffff;
        auVar69._0_8_ = 0x7fffffff7fffffff;
        auVar69._12_4_ = 0x7fffffff;
        auVar69._16_4_ = 0x7fffffff;
        auVar69._20_4_ = 0x7fffffff;
        auVar69._24_4_ = 0x7fffffff;
        auVar69._28_4_ = 0x7fffffff;
        local_27e0 = vandps_avx(ZEXT1632(auVar57),auVar69);
        auVar49 = vcmpps_avx(ZEXT1632(auVar57),ZEXT832(0) << 0x20,4);
        auVar66 = vandps_avx(auVar66,auVar49);
        auVar83._0_4_ = local_2840._0_4_ + local_2820._0_4_;
        auVar83._4_4_ = local_2840._4_4_ + local_2820._4_4_;
        auVar83._8_4_ = local_2840._8_4_ + local_2820._8_4_;
        auVar83._12_4_ = local_2840._12_4_ + local_2820._12_4_;
        auVar83._16_4_ = local_2800._16_4_ + local_2800._16_4_;
        auVar83._20_4_ = local_2800._20_4_ + local_2800._20_4_;
        auVar83._24_4_ = local_2800._24_4_ + local_2800._24_4_;
        auVar83._28_4_ = local_2800._28_4_ + local_2800._28_4_;
        auVar49 = vcmpps_avx(auVar83,local_27e0,2);
        auVar54 = auVar49 & auVar66;
        if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar54 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar54 >> 0x7f,0) != '\0') ||
              (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar54 >> 0xbf,0) != '\0') ||
            (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar54[0x1f] < '\0') {
          auVar66 = vandps_avx(auVar66,auVar49);
          auVar47 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
          auVar20._4_4_ = fVar2 * auVar50._4_4_;
          auVar20._0_4_ = fVar1 * auVar50._0_4_;
          auVar20._8_4_ = fVar7 * auVar50._8_4_;
          auVar20._12_4_ = fVar8 * auVar50._12_4_;
          auVar20._16_4_ = auVar50._16_4_ * 0.0;
          auVar20._20_4_ = auVar50._20_4_ * 0.0;
          auVar20._24_4_ = auVar50._24_4_ * 0.0;
          auVar20._28_4_ = auVar50._28_4_;
          auVar52 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar62),auVar20);
          auVar52 = vfmadd213ps_fma(auVar14,ZEXT1632(auVar48),ZEXT1632(auVar52));
          local_2800._0_4_ = (float)(uVar74 ^ auVar52._0_4_);
          local_2800._4_4_ = (float)(uVar29 ^ auVar52._4_4_);
          local_2800._8_4_ = (float)(uVar76 ^ auVar52._8_4_);
          local_2800._12_4_ = (float)(uVar77 ^ auVar52._12_4_);
          fVar68 = *(float *)(ray + k * 4 + 0x60);
          auVar21._4_4_ = local_27e0._4_4_ * fVar68;
          auVar21._0_4_ = local_27e0._0_4_ * fVar68;
          auVar21._8_4_ = local_27e0._8_4_ * fVar68;
          auVar21._12_4_ = local_27e0._12_4_ * fVar68;
          auVar21._16_4_ = local_27e0._16_4_ * fVar68;
          auVar21._20_4_ = local_27e0._20_4_ * fVar68;
          auVar21._24_4_ = local_27e0._24_4_ * fVar68;
          auVar21._28_4_ = fVar68;
          auVar66 = vcmpps_avx(auVar21,local_2800,1);
          fVar68 = *(float *)(ray + k * 4 + 0x100);
          auVar22._4_4_ = local_27e0._4_4_ * fVar68;
          auVar22._0_4_ = local_27e0._0_4_ * fVar68;
          auVar22._8_4_ = local_27e0._8_4_ * fVar68;
          auVar22._12_4_ = local_27e0._12_4_ * fVar68;
          auVar22._16_4_ = local_27e0._16_4_ * fVar68;
          auVar22._20_4_ = local_27e0._20_4_ * fVar68;
          auVar22._24_4_ = local_27e0._24_4_ * fVar68;
          auVar22._28_4_ = fVar68;
          auVar49 = vcmpps_avx(local_2800,auVar22,2);
          auVar66 = vandps_avx(auVar66,auVar49);
          auVar52 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
          auVar47 = vpand_avx(auVar47,auVar52);
          auVar66 = vpmovzxwd_avx2(auVar47);
          auVar66 = vpslld_avx2(auVar66,0x1f);
          if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar66 >> 0x7f,0) != '\0') ||
                (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar66 >> 0xbf,0) != '\0') ||
              (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar66[0x1f] < '\0') {
            local_28a0 = vpsrad_avx2(auVar66,0x1f);
            local_27c0 = ZEXT1632(auVar48);
            local_27a0 = ZEXT1632(auVar62);
            local_2780 = ZEXT1632(auVar53);
            local_2760 = local_28a0;
            local_2680 = local_25e0;
            pSVar4 = context->scene;
            auVar49 = vrcpps_avx(local_27e0);
            auVar87._8_4_ = 0x3f800000;
            auVar87._0_8_ = &DAT_3f8000003f800000;
            auVar87._12_4_ = 0x3f800000;
            auVar87._16_4_ = 0x3f800000;
            auVar87._20_4_ = 0x3f800000;
            auVar87._24_4_ = 0x3f800000;
            auVar87._28_4_ = 0x3f800000;
            auVar52 = vfnmadd213ps_fma(local_27e0,auVar49,auVar87);
            auVar52 = vfmadd132ps_fma(ZEXT1632(auVar52),auVar49,auVar49);
            fVar68 = auVar52._0_4_;
            fVar71 = auVar52._4_4_;
            local_2700._4_4_ = fVar71 * local_2800._4_4_;
            local_2700._0_4_ = fVar68 * local_2800._0_4_;
            fVar72 = auVar52._8_4_;
            local_2700._8_4_ = fVar72 * local_2800._8_4_;
            fVar73 = auVar52._12_4_;
            local_2700._12_4_ = fVar73 * local_2800._12_4_;
            local_2700._16_4_ = local_2800._16_4_ * 0.0;
            local_2700._20_4_ = local_2800._20_4_ * 0.0;
            local_2700._24_4_ = local_2800._24_4_ * 0.0;
            local_2700._28_4_ = auVar49._28_4_;
            auVar46 = ZEXT3264(local_2700);
            auVar23._4_4_ = fVar71 * local_2840._4_4_;
            auVar23._0_4_ = fVar68 * local_2840._0_4_;
            auVar23._8_4_ = fVar72 * local_2840._8_4_;
            auVar23._12_4_ = fVar73 * local_2840._12_4_;
            auVar23._16_4_ = local_2800._16_4_ * 0.0;
            auVar23._20_4_ = local_2800._20_4_ * 0.0;
            auVar23._24_4_ = local_2800._24_4_ * 0.0;
            auVar23._28_4_ = local_2800._28_4_;
            auVar49 = vminps_avx(auVar23,auVar87);
            auVar24._4_4_ = fVar71 * local_2820._4_4_;
            auVar24._0_4_ = fVar68 * local_2820._0_4_;
            auVar24._8_4_ = fVar72 * local_2820._8_4_;
            auVar24._12_4_ = fVar73 * local_2820._12_4_;
            auVar24._16_4_ = local_2800._16_4_ * 0.0;
            auVar24._20_4_ = local_2800._20_4_ * 0.0;
            auVar24._24_4_ = local_2800._24_4_ * 0.0;
            auVar24._28_4_ = local_2800._28_4_;
            auVar54 = vminps_avx(auVar24,auVar87);
            auVar43 = vsubps_avx(auVar87,auVar49);
            auVar78 = vsubps_avx(auVar87,auVar54);
            local_2720 = vblendvps_avx(auVar54,auVar43,local_25e0);
            local_2740 = vblendvps_avx(auVar49,auVar78,local_25e0);
            fVar68 = local_2600._0_4_;
            local_26e0._0_4_ = auVar48._0_4_ * fVar68;
            fVar71 = local_2600._4_4_;
            local_26e0._4_4_ = auVar48._4_4_ * fVar71;
            fVar72 = local_2600._8_4_;
            local_26e0._8_4_ = auVar48._8_4_ * fVar72;
            fVar73 = local_2600._12_4_;
            local_26e0._12_4_ = auVar48._12_4_ * fVar73;
            fVar9 = local_2600._16_4_;
            local_26e0._16_4_ = fVar9 * 0.0;
            fVar10 = local_2600._20_4_;
            local_26e0._20_4_ = fVar10 * 0.0;
            fVar11 = local_2600._24_4_;
            local_26e0._24_4_ = fVar11 * 0.0;
            local_26e0._28_4_ = 0;
            local_26c0._0_4_ = fVar68 * auVar62._0_4_;
            local_26c0._4_4_ = fVar71 * auVar62._4_4_;
            local_26c0._8_4_ = fVar72 * auVar62._8_4_;
            local_26c0._12_4_ = fVar73 * auVar62._12_4_;
            local_26c0._16_4_ = fVar9 * 0.0;
            local_26c0._20_4_ = fVar10 * 0.0;
            local_26c0._24_4_ = fVar11 * 0.0;
            local_26c0._28_4_ = 0;
            local_26a0._0_4_ = fVar68 * fVar1;
            local_26a0._4_4_ = fVar71 * fVar2;
            local_26a0._8_4_ = fVar72 * fVar7;
            local_26a0._12_4_ = fVar73 * fVar8;
            local_26a0._16_4_ = fVar9 * 0.0;
            local_26a0._20_4_ = fVar10 * 0.0;
            local_26a0._24_4_ = fVar11 * 0.0;
            local_26a0._28_4_ = 0;
            auVar44._8_4_ = 0x7f800000;
            auVar44._0_8_ = 0x7f8000007f800000;
            auVar44._12_4_ = 0x7f800000;
            auVar44._16_4_ = 0x7f800000;
            auVar44._20_4_ = 0x7f800000;
            auVar44._24_4_ = 0x7f800000;
            auVar44._28_4_ = 0x7f800000;
            auVar66 = vblendvps_avx(auVar44,local_2700,auVar66);
            auVar49 = vshufps_avx(auVar66,auVar66,0xb1);
            auVar49 = vminps_avx(auVar66,auVar49);
            auVar54 = vshufpd_avx(auVar49,auVar49,5);
            auVar49 = vminps_avx(auVar49,auVar54);
            auVar54 = vpermpd_avx2(auVar49,0x4e);
            auVar49 = vminps_avx(auVar49,auVar54);
            auVar66 = vcmpps_avx(auVar66,auVar49,0);
            auVar52 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
            auVar47 = vpand_avx(auVar52,auVar47);
            auVar66 = vpmovzxwd_avx2(auVar47);
            auVar66 = vpslld_avx2(auVar66,0x1f);
            if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar66 >> 0x7f,0) == '\0') &&
                  (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar66 >> 0xbf,0) == '\0') &&
                (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar66[0x1f]) {
              auVar66 = local_28a0;
            }
            uVar29 = vmovmskps_avx(auVar66);
            uVar74 = 0;
            for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x80000000) {
              uVar74 = uVar74 + 1;
            }
            do {
              uVar33 = (ulong)uVar74;
              uVar74 = *(uint *)((long)&local_24e0 + uVar33 * 4);
              pGVar5 = (pSVar4->geometries).items[uVar74].ptr;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_28a0 + uVar33 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar28 = *(undefined4 *)(local_2740 + uVar33 * 4);
                  uVar3 = *(undefined4 *)(local_2720 + uVar33 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2700 + uVar33 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_26e0 + uVar33 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_26c0 + uVar33 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_26a0 + uVar33 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar28;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)((long)&local_2860 + uVar33 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar74;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                local_2660 = auVar46._0_32_;
                local_2640 = auVar92._0_32_;
                uVar28 = *(undefined4 *)(local_2740 + uVar33 * 4);
                local_2460._4_4_ = uVar28;
                local_2460._0_4_ = uVar28;
                local_2460._8_4_ = uVar28;
                local_2460._12_4_ = uVar28;
                local_2460._16_4_ = uVar28;
                local_2460._20_4_ = uVar28;
                local_2460._24_4_ = uVar28;
                local_2460._28_4_ = uVar28;
                local_2440 = *(undefined4 *)(local_2720 + uVar33 * 4);
                uVar28 = *(undefined4 *)((long)&local_2860 + uVar33 * 4);
                auVar58._4_4_ = uVar28;
                auVar58._0_4_ = uVar28;
                auVar58._8_4_ = uVar28;
                auVar58._12_4_ = uVar28;
                auVar60._16_4_ = uVar28;
                auVar60._0_16_ = auVar58;
                auVar60._20_4_ = uVar28;
                auVar60._24_4_ = uVar28;
                auVar60._28_4_ = uVar28;
                uVar28 = *(undefined4 *)(local_26e0 + uVar33 * 4);
                uVar3 = *(undefined4 *)(local_26c0 + uVar33 * 4);
                local_24a0._4_4_ = uVar3;
                local_24a0._0_4_ = uVar3;
                local_24a0._8_4_ = uVar3;
                local_24a0._12_4_ = uVar3;
                local_24a0._16_4_ = uVar3;
                local_24a0._20_4_ = uVar3;
                local_24a0._24_4_ = uVar3;
                local_24a0._28_4_ = uVar3;
                uVar3 = *(undefined4 *)(local_26a0 + uVar33 * 4);
                local_2480._4_4_ = uVar3;
                local_2480._0_4_ = uVar3;
                local_2480._8_4_ = uVar3;
                local_2480._12_4_ = uVar3;
                local_2480._16_4_ = uVar3;
                local_2480._20_4_ = uVar3;
                local_2480._24_4_ = uVar3;
                local_2480._28_4_ = uVar3;
                auVar53._4_4_ = uVar74;
                auVar53._0_4_ = uVar74;
                auVar53._8_4_ = uVar74;
                auVar53._12_4_ = uVar74;
                auVar56._16_4_ = uVar74;
                auVar56._0_16_ = auVar53;
                auVar56._20_4_ = uVar74;
                auVar56._24_4_ = uVar74;
                auVar56._28_4_ = uVar74;
                local_24c0[0] = (RTCHitN)(char)uVar28;
                local_24c0[1] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_24c0[2] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_24c0[3] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_24c0[4] = (RTCHitN)(char)uVar28;
                local_24c0[5] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_24c0[6] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_24c0[7] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_24c0[8] = (RTCHitN)(char)uVar28;
                local_24c0[9] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_24c0[10] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_24c0[0xb] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_24c0[0xc] = (RTCHitN)(char)uVar28;
                local_24c0[0xd] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_24c0[0xe] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_24c0[0xf] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_24c0[0x10] = (RTCHitN)(char)uVar28;
                local_24c0[0x11] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_24c0[0x12] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_24c0[0x13] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_24c0[0x14] = (RTCHitN)(char)uVar28;
                local_24c0[0x15] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_24c0[0x16] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_24c0[0x17] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_24c0[0x18] = (RTCHitN)(char)uVar28;
                local_24c0[0x19] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_24c0[0x1a] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_24c0[0x1b] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                local_24c0[0x1c] = (RTCHitN)(char)uVar28;
                local_24c0[0x1d] = (RTCHitN)(char)((uint)uVar28 >> 8);
                local_24c0[0x1e] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                local_24c0[0x1f] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                uStack_243c = local_2440;
                uStack_2438 = local_2440;
                uStack_2434 = local_2440;
                uStack_2430 = local_2440;
                uStack_242c = local_2440;
                uStack_2428 = local_2440;
                uStack_2424 = local_2440;
                local_2420 = auVar60;
                local_2400 = auVar56;
                vpcmpeqd_avx2(local_2460,local_2460);
                uStack_23dc = context->user->instID[0];
                local_23e0 = uStack_23dc;
                uStack_23d8 = uStack_23dc;
                uStack_23d4 = uStack_23dc;
                uStack_23d0 = uStack_23dc;
                uStack_23cc = uStack_23dc;
                uStack_23c8 = uStack_23dc;
                uStack_23c4 = uStack_23dc;
                uStack_23bc = context->user->instPrimID[0];
                local_23c0 = uStack_23bc;
                uStack_23b8 = uStack_23bc;
                uStack_23b4 = uStack_23bc;
                uStack_23b0 = uStack_23bc;
                uStack_23ac = uStack_23bc;
                uStack_23a8 = uStack_23bc;
                uStack_23a4 = uStack_23bc;
                uVar28 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2700 + uVar33 * 4);
                local_2880 = local_2620._0_8_;
                uStack_2878 = local_2620._8_8_;
                uStack_2870 = local_2620._16_8_;
                uStack_2868 = local_2620._24_8_;
                local_28d0.valid = (int *)&local_2880;
                local_28d0.geometryUserPtr = pGVar5->userPtr;
                local_28d0.context = context->user;
                local_28d0.hit = local_24c0;
                local_28d0.N = 8;
                local_28d0.ray = (RTCRayN *)ray;
                if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar56 = ZEXT1632(auVar53);
                  auVar60 = ZEXT1632(auVar58);
                  (*pGVar5->intersectionFilterN)(&local_28d0);
                }
                auVar25._8_8_ = uStack_2878;
                auVar25._0_8_ = local_2880;
                auVar25._16_8_ = uStack_2870;
                auVar25._24_8_ = uStack_2868;
                auVar49 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar25);
                auVar66 = _DAT_0205a980 & ~auVar49;
                if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar66 >> 0x7f,0) == '\0') &&
                      (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar66 >> 0xbf,0) == '\0') &&
                    (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar66[0x1f]) {
                  auVar46 = ZEXT3264(auVar49 ^ _DAT_0205a980);
                }
                else {
                  p_Var6 = context->args->filter;
                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar56 = ZEXT1632(auVar56._0_16_);
                    auVar60 = ZEXT1632(auVar60._0_16_);
                    (*p_Var6)(&local_28d0);
                  }
                  auVar26._8_8_ = uStack_2878;
                  auVar26._0_8_ = local_2880;
                  auVar26._16_8_ = uStack_2870;
                  auVar26._24_8_ = uStack_2868;
                  auVar49 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar26);
                  auVar66 = vpcmpeqd_avx2(auVar60,auVar60);
                  auVar46 = ZEXT3264(auVar49 ^ auVar66);
                  auVar54 = vpcmpeqd_avx2(auVar56,auVar56);
                  auVar66 = auVar66 & ~auVar49;
                  if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar66 >> 0x7f,0) != '\0') ||
                        (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar66 >> 0xbf,0) != '\0') ||
                      (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar66[0x1f] < '\0') {
                    auVar49 = auVar49 ^ auVar54;
                    auVar66 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])local_28d0.hit);
                    *(undefined1 (*) [32])(local_28d0.ray + 0x180) = auVar66;
                    auVar66 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(local_28d0.hit + 0x20));
                    *(undefined1 (*) [32])(local_28d0.ray + 0x1a0) = auVar66;
                    auVar66 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(local_28d0.hit + 0x40));
                    *(undefined1 (*) [32])(local_28d0.ray + 0x1c0) = auVar66;
                    auVar66 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(local_28d0.hit + 0x60));
                    *(undefined1 (*) [32])(local_28d0.ray + 0x1e0) = auVar66;
                    auVar66 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(local_28d0.hit + 0x80));
                    *(undefined1 (*) [32])(local_28d0.ray + 0x200) = auVar66;
                    auVar66 = vpmaskmovd_avx2(auVar49,*(undefined1 (*) [32])(local_28d0.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_28d0.ray + 0x220) = auVar66;
                    auVar66 = vpmaskmovd_avx2(auVar49,*(undefined1 (*) [32])(local_28d0.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_28d0.ray + 0x240) = auVar66;
                    auVar66 = vpmaskmovd_avx2(auVar49,*(undefined1 (*) [32])(local_28d0.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_28d0.ray + 0x260) = auVar66;
                    auVar66 = vpmaskmovd_avx2(auVar49,*(undefined1 (*) [32])(local_28d0.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_28d0.ray + 0x280) = auVar66;
                  }
                }
                auVar66 = auVar46._0_32_;
                if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar66 >> 0x7f,0) == '\0') &&
                      (auVar46 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                     SUB321(auVar66 >> 0xbf,0) == '\0') &&
                    (auVar46 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                    -1 < auVar46[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar28;
                }
                *(undefined4 *)(local_28a0 + uVar33 * 4) = 0;
                uVar28 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar45._4_4_ = uVar28;
                auVar45._0_4_ = uVar28;
                auVar45._8_4_ = uVar28;
                auVar45._12_4_ = uVar28;
                auVar45._16_4_ = uVar28;
                auVar45._20_4_ = uVar28;
                auVar45._24_4_ = uVar28;
                auVar45._28_4_ = uVar28;
                auVar46 = ZEXT3264(local_2660);
                auVar66 = vcmpps_avx(local_2660,auVar45,2);
                local_28a0 = vandps_avx(auVar66,local_28a0);
                auVar92 = ZEXT3264(local_2640);
              }
              if ((((((((local_28a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_28a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_28a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_28a0 >> 0x7f,0) == '\0') &&
                    (local_28a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_28a0 >> 0xbf,0) == '\0') &&
                  (local_28a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_28a0[0x1f]) break;
              auVar51._8_4_ = 0x7f800000;
              auVar51._0_8_ = 0x7f8000007f800000;
              auVar51._12_4_ = 0x7f800000;
              auVar51._16_4_ = 0x7f800000;
              auVar51._20_4_ = 0x7f800000;
              auVar51._24_4_ = 0x7f800000;
              auVar51._28_4_ = 0x7f800000;
              auVar66 = vblendvps_avx(auVar51,auVar46._0_32_,local_28a0);
              auVar49 = vshufps_avx(auVar66,auVar66,0xb1);
              auVar49 = vminps_avx(auVar66,auVar49);
              auVar54 = vshufpd_avx(auVar49,auVar49,5);
              auVar49 = vminps_avx(auVar49,auVar54);
              auVar54 = vpermpd_avx2(auVar49,0x4e);
              auVar49 = vminps_avx(auVar49,auVar54);
              auVar49 = vcmpps_avx(auVar66,auVar49,0);
              auVar54 = local_28a0 & auVar49;
              auVar66 = local_28a0;
              if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar54 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar54 >> 0x7f,0) != '\0') ||
                    (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar54 >> 0xbf,0) != '\0') ||
                  (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar54[0x1f] < '\0') {
                auVar66 = vandps_avx(auVar49,local_28a0);
              }
              uVar29 = vmovmskps_avx(auVar66);
              uVar74 = 0;
              for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x80000000) {
                uVar74 = uVar74 + 1;
              }
            } while( true );
          }
        }
        lVar40 = lVar40 + 1;
      } while (lVar40 != uVar41 - 8);
    }
    uVar28 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar46 = ZEXT3264(CONCAT428(uVar28,CONCAT424(uVar28,CONCAT420(uVar28,CONCAT416(uVar28,CONCAT412
                                                  (uVar28,CONCAT48(uVar28,CONCAT44(uVar28,uVar28))))
                                                  ))));
    auVar64 = ZEXT3264(local_2520);
    auVar67 = ZEXT3264(local_2540);
    auVar70 = ZEXT3264(local_2560);
    auVar75 = ZEXT3264(local_2580);
    auVar81 = ZEXT3264(local_25a0);
    auVar84 = ZEXT3264(local_25c0);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }